

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void duckdb::HistogramBinFinalizeFunction<duckdb::HistogramFunctor,short>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  Value *pVVar8;
  LogicalType *type;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  idx_t iVar12;
  idx_t iVar13;
  long lVar14;
  long lVar15;
  Value *pVVar16;
  long lVar17;
  ulong uVar18;
  UnifiedVectorFormat sdata;
  long *local_b8;
  long local_b0;
  duckdb local_70 [64];
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  pVVar8 = (Value *)duckdb::ListVector::GetListSize(result);
  type = (LogicalType *)duckdb::MapType::KeyType((LogicalType *)(result + 8));
  bVar7 = SupportsOtherBucket(type);
  lVar14 = 0;
  for (iVar12 = 0; count != iVar12; iVar12 = iVar12 + 1) {
    iVar13 = iVar12;
    if (*local_b8 != 0) {
      iVar13 = (idx_t)*(uint *)(*local_b8 + iVar12 * 4);
    }
    plVar2 = *(long **)(local_b0 + iVar13 * 8);
    plVar3 = (long *)*plVar2;
    if (plVar3 != (long *)0x0) {
      lVar14 = (ulong)(*(long *)(*(long *)(plVar2[1] + 8) + -8) != 0 && bVar7) +
               (plVar3[1] - *plVar3 >> 1) + lVar14;
    }
  }
  duckdb::ListVector::Reserve(result,(ulong)(pVVar8 + lVar14));
  uVar9 = duckdb::MapVector::GetKeys(result);
  lVar10 = duckdb::MapVector::GetValues(result);
  lVar14 = *(long *)(result + 0x20);
  lVar10 = *(long *)(lVar10 + 0x20);
  for (uVar18 = 0; uVar18 != count; uVar18 = uVar18 + 1) {
    uVar11 = uVar18;
    if (*local_b8 != 0) {
      uVar11 = (ulong)*(uint *)(*local_b8 + uVar18 * 4);
    }
    plVar2 = *(long **)(local_b0 + uVar11 * 8);
    plVar3 = (long *)*plVar2;
    if (plVar3 == (long *)0x0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),uVar18 + offset);
    }
    else {
      lVar15 = (uVar18 + offset) * 0x10;
      plVar1 = (long *)(lVar14 + lVar15);
      *(Value **)(lVar14 + lVar15) = pVVar8;
      lVar4 = *plVar3;
      lVar5 = plVar3[1];
      lVar15 = lVar10 + (long)pVVar8 * 8;
      lVar6 = *(long *)(uVar9 + 0x20);
      for (lVar17 = 0; lVar5 - lVar4 >> 1 != lVar17; lVar17 = lVar17 + 1) {
        *(undefined2 *)((long)pVVar8 * 2 + lVar6 + lVar17 * 2) = *(undefined2 *)(lVar4 + lVar17 * 2)
        ;
        *(undefined8 *)(lVar15 + lVar17 * 8) = *(undefined8 *)(*(long *)plVar2[1] + lVar17 * 8);
      }
      pVVar16 = pVVar8 + lVar17;
      if (bVar7 && *(long *)(*(long *)(plVar2[1] + 8) + -8) != 0) {
        OtherBucketValue(local_70,(LogicalType *)(uVar9 + 8));
        duckdb::Vector::SetValue(uVar9,pVVar16);
        duckdb::Value::~Value((Value *)local_70);
        *(undefined8 *)(lVar15 + lVar17 * 8) = *(undefined8 *)(*(long *)(plVar2[1] + 8) + -8);
        pVVar16 = pVVar8 + lVar17 + 1;
      }
      plVar1[1] = (long)pVVar16 - *plVar1;
      pVVar8 = pVVar16;
    }
  }
  duckdb::ListVector::SetListSize(result,(ulong)pVVar8);
  duckdb::Vector::Verify((ulong)result);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}